

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Any::Any<std::shared_ptr<henson::BaseCoroutine_const>,void>
          (Any *this,shared_ptr<const_henson::BaseCoroutine> *t_value)

{
  Data_Impl<std::shared_ptr<const_henson::BaseCoroutine>_> *t_type;
  shared_ptr<const_henson::BaseCoroutine> *in_RDI;
  pointer in_stack_ffffffffffffffa8;
  Data_Impl<std::shared_ptr<const_henson::BaseCoroutine>_> *this_00;
  
  t_type = (Data_Impl<std::shared_ptr<const_henson::BaseCoroutine>_> *)operator_new(0x20);
  this_00 = t_type;
  std::shared_ptr<const_henson::BaseCoroutine>::shared_ptr
            (in_RDI,(shared_ptr<const_henson::BaseCoroutine> *)in_stack_ffffffffffffffa8);
  Data_Impl<std::shared_ptr<const_henson::BaseCoroutine>_>::Data_Impl
            (this_00,(shared_ptr<const_henson::BaseCoroutine> *)t_type);
  std::unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
  ::unique_ptr<std::default_delete<chaiscript::detail::Any::Data>,void>
            ((unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
              *)in_RDI,in_stack_ffffffffffffffa8);
  std::shared_ptr<const_henson::BaseCoroutine>::~shared_ptr
            ((shared_ptr<const_henson::BaseCoroutine> *)0x2dc0d4);
  return;
}

Assistant:

explicit Any(ValueType &&t_value)
          : m_data(std::unique_ptr<Data>(new Data_Impl<typename std::decay<ValueType>::type>(std::forward<ValueType>(t_value))))
        {
        }